

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void expression_char(ch_compilation *comp)

{
  char *pcVar1;
  size_t sVar2;
  ch_op *data_start;
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  
  pcVar1 = (comp->previous).lexeme.start;
  sVar2 = (comp->previous).lexeme.size;
  op = OP_CHAR;
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
  if (sVar2 == 2) {
    data_start = &op_1;
    op_1 = OP_HALT;
  }
  else {
    op_2 = (ch_op)pcVar1[1];
    data_start = &op_2;
  }
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,data_start,1);
  return;
}

Assistant:

void expression_char(ch_compilation* comp) {
  ch_lexeme value = comp->previous.lexeme;
  
  EMIT_OP(GET_EMIT(comp), OP_CHAR);
  // 2 characters means the char expression is ''
  // In that case, we emit a null byte
  if (value.size == 2) {
      EMIT_OP(GET_EMIT(comp), 0);
      return;
  }

  EMIT_OP(GET_EMIT(comp), value.start[1]);
}